

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

void __thiscall
tsbp::Packing2D::Initialize
          (Packing2D *this,vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items,Bin *bin
          )

{
  int iVar1;
  size_type sVar2;
  double dVar3;
  allocator<unsigned_long> local_b9;
  value_type_conflict2 local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  allocator<unsigned_long> local_91;
  value_type_conflict2 local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  Rectangle *local_68;
  Rectangle *local_60;
  allocator<unsigned_long> local_41;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  Bin *local_20;
  Bin *bin_local;
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items_local;
  Packing2D *this_local;
  
  local_20 = bin;
  bin_local = (Bin *)items;
  items_local = (vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)this;
  sVar2 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(items);
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::reserve(&this->Items,sVar2);
  sVar2 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size
                    ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)bin_local);
  CLI::std::allocator<unsigned_long>::allocator(&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_40,sVar2,0,&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->PlacedItems,&local_40);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_40);
  CLI::std::allocator<unsigned_long>::~allocator(&local_41);
  local_60 = (Rectangle *)
             CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::begin
                       ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)bin_local);
  local_68 = (Rectangle *)
             CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::end
                       ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)bin_local);
  dVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<tsbp::Rectangle_const*,std::vector<tsbp::Rectangle,std::allocator<tsbp::Rectangle>>>,double,tsbp::Packing2D::Initialize(std::vector<tsbp::Rectangle,std::allocator<tsbp::Rectangle>>const&,tsbp::Bin_const&)::__0>
                    (local_60,local_68);
  this->RemainingItemAreaToPlace = dVar3;
  iVar1 = (local_20->super_Rectangle).Dy;
  local_90 = 0;
  CLI::std::allocator<unsigned_long>::allocator(&local_91);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_88,(long)(iVar1 + 1),&local_90,&local_91);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->PlacedAreaVector,&local_88);
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_88);
  CLI::std::allocator<unsigned_long>::~allocator(&local_91);
  iVar1 = (local_20->super_Rectangle).Dy;
  local_b8 = 0;
  CLI::std::allocator<unsigned_long>::allocator(&local_b9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)(iVar1 + 1),&local_b8,&local_b9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->DeactivatedAreaVector,&local_b0);
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_b0);
  CLI::std::allocator<unsigned_long>::~allocator(&local_b9);
  this->ReducedItemInfeasiblePlacementPoints = 0;
  return;
}

Assistant:

void Packing2D::Initialize(const std::vector<Rectangle>& items, const Bin& bin)
{
    Items.reserve(items.size());
    PlacedItems = boost::dynamic_bitset<>(items.size());
    RemainingItemAreaToPlace = std::accumulate(items.begin(), items.end(), 0.0, [](double volume, const Rectangle& i)
                                               { return volume + i.Area; });
    PlacedAreaVector = std::vector<size_t>(bin.Dy + 1, 0);
    DeactivatedAreaVector = std::vector<size_t>(bin.Dy + 1, 0);
    ReducedItemInfeasiblePlacementPoints = 0;
}